

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O1

void __thiscall Fl_Browser_::display(Fl_Browser_ *this,void *item)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar4;
  undefined4 extraout_var_02;
  int iVar5;
  int Y;
  int H;
  int W;
  int X;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  void *pvVar3;
  undefined4 extraout_var_01;
  
  update_top(this);
  iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
  if ((void *)CONCAT44(extraout_var,iVar1) == item) {
    if (this->position_ == 0) {
      return;
    }
    this->position_ = 0;
    if (this->real_position_ == 0) {
      return;
    }
    Fl_Widget::damage((Fl_Widget *)this,'\x04');
    return;
  }
  bbox(this,&local_34,&local_40,&local_38,&local_3c);
  pvVar4 = this->top_;
  iVar1 = this->offset_;
  iVar5 = -iVar1;
  local_40 = iVar5;
  if (pvVar4 == item) {
    iVar1 = this->real_position_ - iVar1;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    if (iVar5 == this->position_) {
      return;
    }
    this->position_ = iVar5;
    if (iVar5 == this->real_position_) {
      return;
    }
  }
  else {
    iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar4);
    pvVar3 = (void *)CONCAT44(extraout_var_00,iVar2);
    if (pvVar3 != item) {
      if (pvVar3 == (void *)0x0 && pvVar4 == (void *)0x0) {
        return;
      }
      do {
        if (pvVar4 == (void *)0x0) {
          pvVar4 = (void *)0x0;
        }
        else {
          iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar4);
          if (pvVar4 == item) {
            if (local_3c < local_40) {
              iVar5 = (local_40 - (local_3c - iVar1) / 2) + this->real_position_;
              iVar1 = 0;
              if (0 < iVar5) {
                iVar1 = iVar5;
              }
              if (iVar1 == this->position_) {
                return;
              }
              this->position_ = iVar1;
              if (iVar1 == this->real_position_) {
                return;
              }
            }
            else {
              local_40 = (local_40 + iVar1) - local_3c;
              if (local_40 < 1) {
                return;
              }
              iVar5 = local_40 + this->real_position_;
              iVar1 = 0;
              if (0 < iVar5) {
                iVar1 = iVar5;
              }
              if (iVar1 == this->position_) {
                return;
              }
              this->position_ = iVar1;
            }
            goto LAB_001a78c7;
          }
          local_40 = local_40 + iVar1;
          iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar4);
          pvVar4 = (void *)CONCAT44(extraout_var_01,iVar1);
        }
        if (pvVar3 == (void *)0x0) {
          pvVar3 = (void *)0x0;
        }
        else {
          iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar3);
          if (pvVar3 == item) {
            iVar2 = (iVar5 - iVar1) + this->real_position_;
            if (iVar5 < 0) {
              iVar2 = iVar2 - (local_3c - iVar1) / 2;
            }
            iVar1 = 0;
            if (0 < iVar2) {
              iVar1 = iVar2;
            }
            if (iVar1 == this->position_) {
              return;
            }
            this->position_ = iVar1;
            if (iVar1 == this->real_position_) {
              return;
            }
            goto LAB_001a78c7;
          }
          iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar3);
          pvVar3 = (void *)CONCAT44(extraout_var_02,iVar2);
          iVar5 = iVar5 - iVar1;
        }
        if (pvVar4 == (void *)0x0 && pvVar3 == (void *)0x0) {
          return;
        }
      } while( true );
    }
    iVar5 = this->real_position_;
    iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar3);
    iVar5 = iVar5 - (iVar1 + iVar2);
    iVar1 = 0;
    if (0 < iVar5) {
      iVar1 = iVar5;
    }
    if (iVar1 == this->position_) {
      return;
    }
    this->position_ = iVar1;
    if (iVar1 == this->real_position_) {
      return;
    }
  }
LAB_001a78c7:
  Fl_Widget::damage((Fl_Widget *)this,'\x04');
  return;
}

Assistant:

void Fl_Browser_::display(void* item) {

  // First special case - want to display first item in the list?
  update_top();
  if (item == item_first()) {position(0); return;}

  int X, Y, W, H, Yp; bbox(X, Y, W, H);
  void* l = top_;
  Y = Yp = -offset_;
  int h1;

  // 2nd special case - want to display item already displayed at top of browser?
  if (l == item) {position(real_position_+Y); return;} // scroll up a bit

  // 3rd special case - want to display item just above top of browser?
  void* lp = item_prev(l);
  if (lp == item) {position(real_position_+Y-item_quick_height(lp)); return;}

#ifdef DISPLAY_SEARCH_BOTH_WAYS_AT_ONCE
  // search for item.  We search both up and down the list at the same time,
  // this evens up the execution time for the two cases - the old way was
  // much slower for going up than for going down.
  while (l || lp) {
    if (l) {
      h1 = item_quick_height(l);
      if (l == item) {
	if (Y <= H) { // it is visible or right at bottom
	  Y = Y+h1-H; // find where bottom edge is
	  if (Y > 0) position(real_position_+Y); // scroll down a bit
	} else {
	  position(real_position_+Y-(H-h1)/2); // center it
	}
	return;
      }
      Y += h1;
      l = item_next(l);
    }
    if (lp) {
      h1 = item_quick_height(lp);
      Yp -= h1;
      if (lp == item) {
	if ((Yp + h1) >= 0) position(real_position_+Yp);
	else position(real_position_+Yp-(H-h1)/2);
	return;
      }
      lp = item_prev(lp);
    }
  }
#else
  // Old version went forwards and then backwards:
  // search forward for it:
  l = top_;
  for (; l; l = item_next(l)) {
    h1 = item_quick_height(l);
    if (l == item) {
      if (Y <= H) { // it is visible or right at bottom
	Y = Y+h1-H; // find where bottom edge is
	if (Y > 0) position(real_position_+Y); // scroll down a bit
      } else {
	position(real_position_+Y-(H-h1)/2); // center it
      }
      return;
    }
    Y += h1;
  }
  // search backward for it, if found center it:
  l = lp;
  Y = -offset_;
  for (; l; l = item_prev(l)) {
    h1 = item_quick_height(l);
    Y -= h1;
    if (l == item) {
      if ((Y + h1) >= 0) position(real_position_+Y);
      else position(real_position_+Y-(H-h1)/2);
      return;
    }
  }
#endif
}